

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::OverlappingExtensionRangeTest_ExtensionRangeBefore_Test::
TestBody(OverlappingExtensionRangeTest_ExtensionRangeBefore_Test *this)

{
  DescriptorProto *pDVar1;
  void *pvVar2;
  FileDescriptor *pFVar3;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *this_00;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  pointer message;
  char *in_R9;
  pointer *__ptr_2;
  string_view value;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  DescriptorPool pool;
  MockErrorCollector error_collector;
  FileDescriptorProto foo_file;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_208;
  Message local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  AssertHelper local_1f0;
  undefined1 local_1e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 local_1c8 [120];
  MockErrorCollector local_150;
  undefined1 local_108 [248];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_108,(Arena *)0x0);
  local_108[0x10] = local_108[0x10] | 1;
  if ((local_108._8_8_ & 1) != 0) {
    local_108._8_8_ = *(undefined8 *)(local_108._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "foo.proto";
  value._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)(local_108 + 200),value,(Arena *)local_108._8_8_);
  local_1c8._0_8_ = local_1c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Foo","");
  pDVar1 = AddMessage((FileDescriptorProto *)local_108,(string *)local_1c8);
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  this_00 = &(pDVar1->field_0)._impl_.extension_range_;
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&this_00->super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto_ExtensionRange>);
  *(undefined8 *)((long)pvVar2 + 0x20) = 0x140000000a;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 6;
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&this_00->super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto_ExtensionRange>);
  *(undefined8 *)((long)pvVar2 + 0x20) = 0xf00000005;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 6;
  DescriptorPool::DescriptorPool((DescriptorPool *)local_1c8);
  local_150.text_._M_dataplus._M_p = (pointer)&local_150.text_.field_2;
  local_150.super_ErrorCollector._vptr_ErrorCollector =
       (_func_int **)&PTR__MockErrorCollector_018e1730;
  local_150.text_._M_string_length = 0;
  local_150.text_.field_2._M_local_buf[0] = '\0';
  local_150.warning_text_._M_dataplus._M_p = (pointer)&local_150.warning_text_.field_2;
  local_150.warning_text_._M_string_length = 0;
  local_150.warning_text_.field_2._M_local_buf[0] = '\0';
  pFVar3 = DescriptorPool::BuildFileCollectingErrors
                     ((DescriptorPool *)local_1c8,(FileDescriptorProto *)local_108,
                      &local_150.super_ErrorCollector);
  local_200.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)(pFVar3 == (FileDescriptor *)0x0);
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_200.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_1_) {
    testing::internal::CmpHelperEQ<char[95],std::__cxx11::string>
              ((internal *)local_1e8,
               "\"foo.proto: Foo: NUMBER: Extension range 5 to 14 overlaps with \" \"already-defined range 10 to 19.\\n\""
               ,"error_collector.text_",
               (char (*) [95])
               "foo.proto: Foo: NUMBER: Extension range 5 to 14 overlaps with already-defined range 10 to 19.\n"
               ,&local_150.text_);
    if (local_1e8[0] == (internal)0x0) {
      testing::Message::Message(&local_200);
      if (local_1e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = anon_var_dwarf_a12c75 + 5;
      }
      else {
        message = (local_1e0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_208,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x9ef,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,&local_200);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
      if ((long *)CONCAT71(local_200.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_200.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_200.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_200.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
      }
    }
    if (local_1e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0057b7a9;
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_1e0;
  }
  else {
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_1f8;
    testing::Message::Message((Message *)&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1e8,(internal *)&local_200,
               (AssertionResult *)
               "pool.BuildFileCollectingErrors(foo_file, &error_collector) == nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x9eb,(char *)CONCAT71(local_1e8._1_7_,local_1e8[0]));
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1e8._1_7_,local_1e8[0]) != &local_1d8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_1e8._1_7_,local_1e8[0]),local_1d8._M_allocated_capacity + 1)
      ;
    }
    if (local_208._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_208._M_head_impl + 8))();
    }
    local_1e0 = local_1f8;
    if (local_1f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0057b7a9;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_01,local_1e0);
LAB_0057b7a9:
  MockErrorCollector::~MockErrorCollector(&local_150);
  DescriptorPool::~DescriptorPool((DescriptorPool *)local_1c8);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_108);
  return;
}

Assistant:

TEST(OverlappingExtensionRangeTest, ExtensionRangeBefore) {
  // Build descriptors for the following definitions:
  //
  //   message Foo {
  //     extensions 10 to 19;
  //     extensions 5 to 14;
  //   }
  FileDescriptorProto foo_file;
  foo_file.set_name("foo.proto");

  DescriptorProto* foo = AddMessage(&foo_file, "Foo");
  AddExtensionRange(foo, 10, 20);
  AddExtensionRange(foo, 5, 15);

  DescriptorPool pool;
  MockErrorCollector error_collector;
  // The extensions ranges are invalid, so the proto shouldn't build.
  ASSERT_TRUE(pool.BuildFileCollectingErrors(foo_file, &error_collector) ==
              nullptr);
  ASSERT_EQ(
      "foo.proto: Foo: NUMBER: Extension range 5 to 14 overlaps with "
      "already-defined range 10 to 19.\n",
      error_collector.text_);
}